

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O2

void __thiscall Uniforms::checkUniforms(Uniforms *this,string *_vert_src,string *_frag_src)

{
  bool bVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  string name;
  string arrayName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (p_Var3 = (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->functions)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1)
                   ,";");
    std::operator+(&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1)
                   ,"[");
    bVar1 = findId(_vert_src,local_70._M_dataplus._M_p);
    bVar2 = true;
    if (!bVar1) {
      bVar1 = findId(_frag_src,local_70._M_dataplus._M_p);
      if (!bVar1) {
        bVar2 = findId(_frag_src,local_50._M_dataplus._M_p);
      }
    }
    if ((bool)(char)p_Var3[5]._M_color != bVar2) {
      *(bool *)&p_Var3[5]._M_color = bVar2;
      this->m_change = true;
    }
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void Uniforms::checkUniforms( const std::string &_vert_src, const std::string &_frag_src ) {
    // Check active native uniforms
    for (UniformFunctionsMap::iterator it = functions.begin(); it != functions.end(); ++it) {
        std::string name = it->first + ";";
        std::string arrayName = it->first + "[";
        bool present = ( findId(_vert_src, name.c_str()) || findId(_frag_src, name.c_str()) || findId(_frag_src, arrayName.c_str()) );
        if ( it->second.present != present ) {
            it->second.present = present;
            m_change = true;
        } 
    }
}